

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O2

bool __thiscall cmUuid::IntFromHexDigit(cmUuid *this,char input,char *output)

{
  byte bVar1;
  
  bVar1 = input - 0x30;
  if (9 < bVar1) {
    if ((byte)(input + 0x9fU) < 6) {
      bVar1 = input + 0xa9;
    }
    else {
      if (5 < (byte)(input + 0xbfU)) {
        return false;
      }
      bVar1 = input - 0x37;
    }
  }
  *output = bVar1;
  return true;
}

Assistant:

bool cmUuid::IntFromHexDigit(char input, char& output) const
{
  if(input >= '0' && input <= '9')
    {
    output = char(input - '0');
    return true;
    }
  else if(input >= 'a' && input <= 'f')
    {
    output = char(input - 'a' + 0xA);
    return true;
    }
  else if(input >= 'A' && input <= 'F')
    {
    output = char(input - 'A' + 0xA);
    return true;
    }
  else
    {
    return false;
    }
}